

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::SimpleNode::AnnotatePass2
          (SimpleNode *this,Compiler *compiler,CountDomain accumConsumes,
          bool accumPrevWillNotProgress,bool accumPrevWillNotRegress)

{
  bool accumPrevWillNotRegress_local;
  bool accumPrevWillNotProgress_local;
  Compiler *compiler_local;
  SimpleNode *this_local;
  CountDomain accumConsumes_local;
  
  (this->super_Node).prevConsumes = accumConsumes;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffbf | (uint)accumPrevWillNotProgress << 6;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffff7f | (uint)accumPrevWillNotRegress << 7;
  return;
}

Assistant:

void SimpleNode::AnnotatePass2(Compiler& compiler, CountDomain accumConsumes, bool accumPrevWillNotProgress, bool accumPrevWillNotRegress)
    {
        prevConsumes = accumConsumes;
        isPrevWillNotProgress = accumPrevWillNotProgress;
        isPrevWillNotRegress = accumPrevWillNotRegress;
    }